

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5CreateTokenizer_v2
              (fts5_api *pApi,char *zName,void *pUserData,fts5_tokenizer_v2 *pTokenizer,
              _func_void_void_ptr *xDestroy)

{
  long lVar1;
  Fts5TokenizerModule **in_RCX;
  _func_void_void_ptr *in_RDX;
  void *in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  int rc;
  Fts5Global *pGlobal;
  Fts5TokenizerModule *pNew;
  int local_44;
  long lVar2;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(int *)in_RCX < 3) {
    lVar2 = 0;
    local_44 = fts5NewTokenizerModule((Fts5Global *)0x0,in_RDI,in_RSI,in_RDX,in_RCX);
    if (lVar2 != 0) {
      *(Fts5TokenizerModule **)(lVar2 + 0x30) = *in_RCX;
      *(Fts5TokenizerModule **)(lVar2 + 0x38) = in_RCX[1];
      *(Fts5TokenizerModule **)(lVar2 + 0x40) = in_RCX[2];
      *(Fts5TokenizerModule **)(lVar2 + 0x48) = in_RCX[3];
      *(undefined4 *)(lVar2 + 0x10) = 1;
      *(code **)(lVar2 + 0x18) = fts5VtoVCreate;
      *(code **)(lVar2 + 0x28) = fts5V1toV2Tokenize;
      *(code **)(lVar2 + 0x20) = fts5VtoVDelete;
    }
  }
  else {
    local_44 = 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_44;
}

Assistant:

static int fts5CreateTokenizer_v2(
  fts5_api *pApi,                 /* Global context (one per db handle) */
  const char *zName,              /* Name of new function */
  void *pUserData,                /* User data for aux. function */
  fts5_tokenizer_v2 *pTokenizer,  /* Tokenizer implementation */
  void(*xDestroy)(void*)          /* Destructor for pUserData */
){
  Fts5Global *pGlobal = (Fts5Global*)pApi;
  int rc = SQLITE_OK;

  if( pTokenizer->iVersion>2 ){
    rc = SQLITE_ERROR;
  }else{
    Fts5TokenizerModule *pNew = 0;
    rc = fts5NewTokenizerModule(pGlobal, zName, pUserData, xDestroy, &pNew);
    if( pNew ){
      pNew->x2 = *pTokenizer;
      pNew->bV2Native = 1;
      pNew->x1.xCreate = fts5VtoVCreate;
      pNew->x1.xTokenize = fts5V1toV2Tokenize;
      pNew->x1.xDelete = fts5VtoVDelete;
    }
  }

  return rc;
}